

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

size_t __thiscall argo::lexer::read_digits(lexer *this,size_t *index)

{
  uint c_00;
  int iVar1;
  size_t sStack_20;
  int c;
  size_t num_digits;
  size_t *index_local;
  lexer *this_local;
  
  sStack_20 = 0;
  while( true ) {
    c_00 = (*this->m_reader->_vptr_reader[2])();
    iVar1 = isdigit(c_00);
    if (iVar1 == 0) break;
    append_to_number_buffer(this,this->m_buffer,index,c_00);
    sStack_20 = sStack_20 + 1;
  }
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)c_00);
  return sStack_20;
}

Assistant:

size_t lexer::read_digits(size_t &index)
{
    size_t num_digits = 0;

    while (true)
    {
        int c = m_reader.next();
        if (isdigit(c))
        {
            append_to_number_buffer(m_buffer, index, c);
            num_digits++;
        }
        else
        {
            m_reader.put_back(c);
            return num_digits;
        }
    }
}